

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# step.cpp
# Opt level: O0

bool __thiscall step::can_apply(step *this)

{
  int iVar1;
  bool bVar2;
  int *in_RDI;
  byte local_21;
  bool local_1;
  
  iVar1 = *in_RDI;
  if (iVar1 == 0) {
    bVar2 = bucket::full(*(bucket **)(in_RDI + 2));
    local_1 = (bool)((bVar2 ^ 0xffU) & 1);
  }
  else if (iVar1 == 1) {
    bVar2 = bucket::empty(*(bucket **)(in_RDI + 2));
    local_1 = (bool)((bVar2 ^ 0xffU) & 1);
  }
  else {
    if (iVar1 != 2) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zabereer[P]water_crisis/step.cpp"
                    ,0x27,"bool step::can_apply() const");
    }
    bVar2 = bucket::empty(*(bucket **)(in_RDI + 2));
    local_21 = 0;
    if (!bVar2) {
      bVar2 = bucket::full(*(bucket **)(in_RDI + 4));
      local_21 = bVar2 ^ 0xff;
    }
    local_1 = (bool)(local_21 & 1);
  }
  return local_1;
}

Assistant:

bool step::can_apply() const
{
	switch (step_action) {
	case action::fill :
		return !bucket1->full();
	case action::empty :
		return !bucket1->empty();
	case action::transfer :
		return !bucket1->empty() && !bucket2->full();
	default:
		assert(false);
	}
	return false;
}